

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hdr_histogram_log.c
# Opt level: O0

int hdr_encode_compressed(hdr_histogram *h,uint8_t **compressed_histogram,size_t *compressed_len)

{
  int32_t iVar1;
  int iVar2;
  __uint32_t _Var3;
  __uint64_t _Var4;
  uint64_t __bsx;
  long lVar5;
  bool bVar6;
  int local_78;
  int local_74;
  int32_t zeros;
  int64_t value;
  size_t encoded_len;
  int32_t counts_limit;
  int32_t len_to_max;
  size_t compressed_size;
  uLongf dest_len;
  uLong encoded_size;
  int32_t payload_len;
  int data_index;
  int result;
  int i;
  compression_flyweight_t *compressed;
  encoding_flyweight_v1_t *encoded;
  size_t *compressed_len_local;
  uint8_t **compressed_histogram_local;
  hdr_histogram *h_local;
  
  compressed = (compression_flyweight_t *)0x0;
  _result = (__uint32_t *)0x0;
  payload_len = 0;
  encoded_size._4_4_ = 0;
  encoded = (encoding_flyweight_v1_t *)compressed_len;
  compressed_len_local = (size_t *)compressed_histogram;
  compressed_histogram_local = (uint8_t **)h;
  iVar1 = counts_index_for(h,h->max_value);
  local_78 = iVar1 + 1;
  if (*(int *)(compressed_histogram_local + 10) <= local_78) {
    local_78 = *(int *)(compressed_histogram_local + 10);
  }
  compressed = (compression_flyweight_t *)calloc((long)local_78 * 9 + 0x28,1);
  if (compressed == (compression_flyweight_t *)0x0) {
    payload_len = 0xc;
  }
  else {
    data_index = 0;
    while (data_index < local_78) {
      lVar5 = (long)data_index;
      data_index = data_index + 1;
      if (*(long *)(compressed_histogram_local[0xc] + lVar5 * 8) == 0) {
        local_74 = 1;
        while( true ) {
          bVar6 = false;
          if (data_index < local_78) {
            bVar6 = *(long *)(compressed_histogram_local[0xc] + (long)data_index * 8) == 0;
          }
          if (!bVar6) break;
          local_74 = local_74 + 1;
          data_index = data_index + 1;
        }
        iVar2 = zig_zag_encode_i64(compressed[4].data + (long)(int)encoded_size._4_4_ + -4,
                                   (long)-local_74);
        encoded_size._4_4_ = iVar2 + encoded_size._4_4_;
      }
      else {
        iVar2 = zig_zag_encode_i64(compressed[4].data + (long)(int)encoded_size._4_4_ + -4,
                                   *(long *)(compressed_histogram_local[0xc] + lVar5 * 8));
        encoded_size._4_4_ = iVar2 + encoded_size._4_4_;
      }
    }
    encoded_size._0_4_ = encoded_size._4_4_;
    dest_len = (long)(int)encoded_size._4_4_ + 0x28;
    _Var3 = __bswap_32(0x1c849313);
    compressed->cookie = _Var3;
    _Var3 = __bswap_32((__uint32_t)encoded_size);
    compressed->length = _Var3;
    _Var3 = __bswap_32(*(__uint32_t *)(compressed_histogram_local + 8));
    *(__uint32_t *)compressed->data = _Var3;
    _Var3 = __bswap_32(*(__uint32_t *)((long)compressed_histogram_local + 0x14));
    *(__uint32_t *)((long)&compressed[1].cookie + 3) = _Var3;
    _Var4 = __bswap_64((__uint64_t)*compressed_histogram_local);
    *(__uint64_t *)((long)&compressed[1].length + 3) = _Var4;
    _Var4 = __bswap_64((__uint64_t)compressed_histogram_local[1]);
    *(__uint64_t *)((long)&compressed[2].length + 2) = _Var4;
    __bsx = double_to_int64_bits((double)compressed_histogram_local[9]);
    _Var4 = __bswap_64(__bsx);
    *(__uint64_t *)((long)&compressed[3].length + 1) = _Var4;
    compressed_size = compressBound(dest_len);
    _result = (__uint32_t *)malloc(compressed_size + 8);
    if (_result == (__uint32_t *)0x0) {
      payload_len = 0xc;
    }
    else {
      iVar2 = compress(_result + 2,&compressed_size,compressed,dest_len);
      if (iVar2 == 0) {
        _Var3 = __bswap_32(0x1c849314);
        *_result = _Var3;
        _Var3 = __bswap_32((__uint32_t)compressed_size);
        _result[1] = _Var3;
        *compressed_len_local = (size_t)_result;
        *(size_t *)encoded = compressed_size + 8;
      }
      else {
        payload_len = -0x752c;
      }
    }
  }
  free(compressed);
  if (payload_len == -0x752c) {
    free(_result);
  }
  return payload_len;
}

Assistant:

int hdr_encode_compressed(
    struct hdr_histogram* h,
    uint8_t** compressed_histogram,
    size_t* compressed_len)
{
    encoding_flyweight_v1_t* encoded = NULL;
    compression_flyweight_t* compressed = NULL;
    int i;
    int result = 0;
    int data_index = 0;
    int32_t payload_len;
    uLong encoded_size;
    uLongf dest_len;
    size_t compressed_size;

    int32_t len_to_max = counts_index_for(h, h->max_value) + 1;
    int32_t counts_limit = len_to_max < h->counts_len ? len_to_max : h->counts_len;

    const size_t encoded_len = SIZEOF_ENCODING_FLYWEIGHT_V1 + MAX_BYTES_LEB128 * (size_t) counts_limit;
    if ((encoded = (encoding_flyweight_v1_t*) hdr_calloc(encoded_len, sizeof(uint8_t))) == NULL)
    {
        FAIL_AND_CLEANUP(cleanup, result, ENOMEM);
    }

    for (i = 0; i < counts_limit;)
    {
        int64_t value = h->counts[i];
        i++;

        if (value == 0)
        {
            int32_t zeros = 1;

            while (i < counts_limit && 0 == h->counts[i])
            {
                zeros++;
                i++;
            }

            data_index += zig_zag_encode_i64(&encoded->counts[data_index], -zeros);
        }
        else
        {
            data_index += zig_zag_encode_i64(&encoded->counts[data_index], value);
        }
    }

    payload_len = data_index;
    encoded_size = SIZEOF_ENCODING_FLYWEIGHT_V1 + data_index;

    encoded->cookie                   = htobe32(V2_ENCODING_COOKIE | 0x10U);
    encoded->payload_len              = htobe32(payload_len);
    encoded->normalizing_index_offset = htobe32(h->normalizing_index_offset);
    encoded->significant_figures      = htobe32(h->significant_figures);
    encoded->lowest_discernible_value   = htobe64(h->lowest_discernible_value);
    encoded->highest_trackable_value  = htobe64(h->highest_trackable_value);
    encoded->conversion_ratio_bits    = htobe64(double_to_int64_bits(h->conversion_ratio));


    /* Estimate the size of the compressed histogram. */
    dest_len = compressBound(encoded_size);
    compressed_size = SIZEOF_COMPRESSION_FLYWEIGHT + dest_len;

    if ((compressed = (compression_flyweight_t*) hdr_malloc(compressed_size)) == NULL)
    {
        FAIL_AND_CLEANUP(cleanup, result, ENOMEM);
    }

    if (Z_OK != compress(compressed->data, &dest_len, (Bytef*) encoded, encoded_size))
    {
        FAIL_AND_CLEANUP(cleanup, result, HDR_DEFLATE_FAIL);
    }

    compressed->cookie = htobe32(V2_COMPRESSION_COOKIE | 0x10U);
    compressed->length = htobe32((int32_t)dest_len);

    *compressed_histogram = (uint8_t*) compressed;
    *compressed_len = SIZEOF_COMPRESSION_FLYWEIGHT + dest_len;

    cleanup:
    hdr_free(encoded);
    if (result == HDR_DEFLATE_FAIL)
    {
        hdr_free(compressed);
    }

    return result;
}